

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::printList(Graph *this)

{
  uint uVar1;
  ostream *poVar2;
  int j;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  
  uVar1 = this->num_of_vert;
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"Successors");
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar3 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar3;
  }
  while (uVar3 != uVar5) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(uVar3 + 1));
    std::operator<<(poVar2,":");
    pvVar6 = this->adj_list + uVar3;
    for (lVar4 = 0;
        lVar4 < (int)((ulong)((long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start) >> 2); lVar4 = lVar4 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"-> ");
      std::ostream::operator<<
                (poVar2,(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar4]);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void Graph::printList(){
   int nv = this->num_of_vert;
   cout << endl << "Successors" << endl;
   for(int i = 0; i < nv; i++){
      cout << i + 1 << ":";
      for(int j = 0; j < (int)adj_list[i].size(); j++)
         cout << "-> " << this->adj_list[i][j];
      cout << endl;
   }
   return void();
}